

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O0

Maybe<kj::Exception> *
capnp::compiler::anon_unknown_0::loadFile
          (Maybe<kj::Exception> *__return_storage_ptr__,Reader file,SchemaLoader *loader,
          bool allNodes,Maybe<kj::Own<capnp::MallocMessageBuilder>_> *messageBuilder,
          uint sharedOrdinalCount)

{
  Reader brand;
  Reader brand_00;
  Reader reader;
  uint64_t uVar1;
  MallocMessageBuilder *pMVar2;
  MallocMessageBuilder *this;
  SchemaLoader *pSVar3;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *func;
  StructSchema schema_00;
  uint in_R9D;
  Orphanage orphanage;
  int *local_378;
  SchemaLoader *local_370;
  Schema local_368;
  Schema SStack_360;
  SegmentReader *local_358;
  CapTableReader *pCStack_350;
  void *local_348;
  WirePointer *pWStack_340;
  StructDataBitCount local_338;
  StructPointerCount SStack_334;
  undefined2 uStack_332;
  undefined1 local_328 [8];
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_evolution_test_c__:711:7)>
  _kjContext711;
  anon_class_8_1_89912de0 _kjContextFunc711;
  Reader local_2c8;
  Schema local_298;
  Schema local_290;
  Builder local_288;
  undefined1 auStack_258 [8];
  Reader root;
  Own<capnp::MallocMessageBuilder> *m_1;
  Reader local_208;
  Schema local_1d8;
  Schema schema;
  Schema *__end3;
  Schema *__begin3;
  Array<capnp::Schema> *local_1a8;
  Array<capnp::Schema> *__range3;
  Reader local_198;
  Schema local_160;
  Schema local_158;
  Orphanage local_150;
  Orphan<capnp::DynamicStruct> local_140;
  Own<capnp::MallocMessageBuilder> *local_118;
  Own<capnp::MallocMessageBuilder> *m;
  Fault f;
  undefined1 local_c0 [8];
  ModuleImpl module;
  Compiler compiler;
  uint sharedOrdinalCount_local;
  Maybe<kj::Own<capnp::MallocMessageBuilder>_> *messageBuilder_local;
  bool allNodes_local;
  SchemaLoader *loader_local;
  
  Compiler::Compiler((Compiler *)&module.content._reader.nestingLimit,COMPILE_ANNOTATIONS);
  ModuleImpl::ModuleImpl((ModuleImpl *)local_c0,file);
  uVar1 = Compiler::add((Compiler *)&module.content._reader.nestingLimit,(Module *)local_c0);
  if (uVar1 == 0x8123456789abcdef) {
    if (allNodes) {
      Compiler::eagerlyCompile
                ((Compiler *)&module.content._reader.nestingLimit,0x8123456789abcdef,0xffffffff);
      local_118 = kj::_::readMaybe<capnp::MallocMessageBuilder>(messageBuilder);
      if (local_118 != (Own<capnp::MallocMessageBuilder> *)0x0) {
        pMVar2 = kj::Own<capnp::MallocMessageBuilder>::get(local_118);
        this = kj::Own<capnp::MallocMessageBuilder>::get(local_118);
        local_150 = MessageBuilder::getOrphanage(&this->super_MessageBuilder);
        pSVar3 = Compiler::getLoader((Compiler *)&module.content._reader.nestingLimit);
        local_198._reader.dataSize = 0;
        local_198._reader.pointerCount = 0;
        local_198._reader._38_2_ = 0;
        local_198._reader.nestingLimit = 0;
        local_198._reader._44_4_ = 0;
        local_198._reader.data = (void *)0x0;
        local_198._reader.pointers = (WirePointer *)0x0;
        local_198._reader.segment = (SegmentReader *)0x0;
        local_198._reader.capTable = (CapTableReader *)0x0;
        capnp::schema::Brand::Reader::Reader(&local_198);
        Schema::Schema((Schema *)&__range3);
        brand._reader.capTable = local_198._reader.capTable;
        brand._reader.segment = local_198._reader.segment;
        brand._reader.data = local_198._reader.data;
        brand._reader.pointers = local_198._reader.pointers;
        brand._reader.dataSize = local_198._reader.dataSize;
        brand._reader.pointerCount = local_198._reader.pointerCount;
        brand._reader._38_2_ = local_198._reader._38_2_;
        brand._reader.nestingLimit = local_198._reader.nestingLimit;
        brand._reader._44_4_ = local_198._reader._44_4_;
        local_160 = SchemaLoader::get(pSVar3,0x823456789abcdef1,brand,(Schema)__range3);
        local_158.raw = (RawBrandedSchema *)Schema::asStruct(&local_160);
        schema_00.super_Schema.raw._4_4_ = 0;
        schema_00.super_Schema.raw._0_4_ = sharedOrdinalCount;
        orphanage.capTable = (CapTableBuilder *)local_158.raw;
        orphanage.arena = (BuilderArena *)local_150.capTable;
        makeExampleStruct(&local_140,(anon_unknown_0 *)local_150.arena,orphanage,schema_00,in_R9D);
        MessageBuilder::adoptRoot<capnp::DynamicStruct>(&pMVar2->super_MessageBuilder,&local_140);
        Orphan<capnp::DynamicStruct>::~Orphan(&local_140);
      }
      pSVar3 = Compiler::getLoader((Compiler *)&module.content._reader.nestingLimit);
      SchemaLoader::getAllLoaded((Array<capnp::Schema> *)&__begin3,pSVar3);
      local_1a8 = (Array<capnp::Schema> *)&__begin3;
      __end3 = kj::Array<capnp::Schema>::begin(local_1a8);
      schema.raw = (RawBrandedSchema *)kj::Array<capnp::Schema>::end(local_1a8);
      for (; (RawBrandedSchema *)__end3 != schema.raw; __end3 = __end3 + 1) {
        local_1d8 = (Schema)__end3->raw;
        Schema::getProto(&local_208,&local_1d8);
        SchemaLoader::load(loader,&local_208);
      }
      kj::Array<capnp::Schema>::~Array((Array<capnp::Schema> *)&__begin3);
      kj::Maybe<kj::Exception>::Maybe(__return_storage_ptr__,(void *)0x0);
    }
    else {
      Compiler::eagerlyCompile
                ((Compiler *)&module.content._reader.nestingLimit,0x8123456789abcdef,1);
      root.reader._40_8_ = kj::_::readMaybe<capnp::MallocMessageBuilder>(messageBuilder);
      func = extraout_RDX;
      if ((Own<capnp::MallocMessageBuilder> *)root.reader._40_8_ !=
          (Own<capnp::MallocMessageBuilder> *)0x0) {
        pMVar2 = kj::Own<capnp::MallocMessageBuilder>::get
                           ((Own<capnp::MallocMessageBuilder> *)root.reader._40_8_);
        pSVar3 = Compiler::getLoader((Compiler *)&module.content._reader.nestingLimit);
        local_2c8._reader.dataSize = 0;
        local_2c8._reader.pointerCount = 0;
        local_2c8._reader._38_2_ = 0;
        local_2c8._reader.nestingLimit = 0;
        local_2c8._reader._44_4_ = 0;
        local_2c8._reader.data = (void *)0x0;
        local_2c8._reader.pointers = (WirePointer *)0x0;
        local_2c8._reader.segment = (SegmentReader *)0x0;
        local_2c8._reader.capTable = (CapTableReader *)0x0;
        capnp::schema::Brand::Reader::Reader(&local_2c8);
        Schema::Schema((Schema *)&_kjContextFunc711);
        brand_00._reader.capTable = local_2c8._reader.capTable;
        brand_00._reader.segment = local_2c8._reader.segment;
        brand_00._reader.data = local_2c8._reader.data;
        brand_00._reader.pointers = local_2c8._reader.pointers;
        brand_00._reader.dataSize = local_2c8._reader.dataSize;
        brand_00._reader.pointerCount = local_2c8._reader.pointerCount;
        brand_00._reader._38_2_ = local_2c8._reader._38_2_;
        brand_00._reader.nestingLimit = local_2c8._reader.nestingLimit;
        brand_00._reader._44_4_ = local_2c8._reader._44_4_;
        local_298 = SchemaLoader::get(pSVar3,0x823456789abcdef1,brand_00,
                                      (Schema)_kjContextFunc711.root);
        local_290.raw = (RawBrandedSchema *)Schema::asStruct(&local_298);
        MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                  (&local_288,&pMVar2->super_MessageBuilder,(StructSchema)local_290.raw);
        DynamicStruct::Builder::asReader((Reader *)auStack_258,&local_288);
        _kjContext711.func = (anon_class_8_1_89912de0 *)auStack_258;
        kj::_::Debug::
        ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++:711:7)>
        ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_evolution_test_c__:711:7)>
                       *)local_328,(anon_class_8_1_89912de0 *)&_kjContext711.func);
        local_338 = root.reader.dataSize;
        SStack_334 = root.reader.pointerCount;
        uStack_332 = root.reader._38_2_;
        local_348 = root.reader.data;
        pWStack_340 = root.reader.pointers;
        local_358 = root.reader.segment;
        pCStack_350 = root.reader.capTable;
        local_368.raw = (RawBrandedSchema *)auStack_258;
        SStack_360 = root.schema.super_Schema.raw;
        reader.reader.segment = (SegmentReader *)root.schema.super_Schema.raw;
        reader.schema.super_Schema.raw = (Schema)(Schema)auStack_258;
        reader.reader.capTable = (CapTableReader *)root.reader.segment;
        reader.reader.data = root.reader.capTable;
        reader.reader.pointers = (WirePointer *)root.reader.data;
        reader.reader._32_8_ = root.reader.pointers;
        reader.reader.nestingLimit = root.reader.dataSize;
        reader.reader._44_2_ = root.reader.pointerCount;
        reader.reader._46_2_ = root.reader._38_2_;
        checkExampleStruct(reader,sharedOrdinalCount);
        kj::_::Debug::
        ContextImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++:711:7)>
        ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_compiler_evolution_test_c__:711:7)>
                        *)local_328);
        func = extraout_RDX_00;
      }
      local_378 = &module.content._reader.nestingLimit;
      local_370 = loader;
      kj::
      runCatchingExceptions<capnp::compiler::(anonymous_namespace)::loadFile(capnp::compiler::ParsedFile::Reader,capnp::SchemaLoader&,bool,kj::Maybe<kj::Own<capnp::MallocMessageBuilder>>&,unsigned_int)::__1>
                (__return_storage_ptr__,(kj *)&local_378,func);
    }
    Compiler::~Compiler((Compiler *)&module.content._reader.nestingLimit);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&m,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
             ,0x2ad,FAILED,"compiler.add(module) == 0x8123456789abcdefllu","");
  kj::_::Debug::Fault::fatal((Fault *)&m);
}

Assistant:

static kj::Maybe<kj::Exception> loadFile(
    ParsedFile::Reader file, SchemaLoader& loader, bool allNodes,
    kj::Maybe<kj::Own<MallocMessageBuilder>>& messageBuilder,
    uint sharedOrdinalCount) {
  Compiler compiler;
  ModuleImpl module(file);
  KJ_ASSERT(compiler.add(module) == 0x8123456789abcdefllu);

  if (allNodes) {
    // Eagerly compile and load the whole thing.
    compiler.eagerlyCompile(0x8123456789abcdefllu, Compiler::ALL_RELATED_NODES);

    KJ_IF_MAYBE(m, messageBuilder) {
      // Build an example struct using the compiled schema.
      m->get()->adoptRoot(makeExampleStruct(
          m->get()->getOrphanage(), compiler.getLoader().get(0x823456789abcdef1llu).asStruct(),
          sharedOrdinalCount));
    }

    for (auto schema: compiler.getLoader().getAllLoaded()) {
      loader.load(schema.getProto());
    }
    return nullptr;
  } else {
    // Compile the file root so that the children are findable, then load the specific child
    // we want.
    compiler.eagerlyCompile(0x8123456789abcdefllu, Compiler::NODE);

    KJ_IF_MAYBE(m, messageBuilder) {
      // Check that the example struct matches the compiled schema.
      auto root = m->get()->getRoot<DynamicStruct>(
          compiler.getLoader().get(0x823456789abcdef1llu).asStruct()).asReader();
      KJ_CONTEXT(root);
      checkExampleStruct(root, sharedOrdinalCount);
    }

    return kj::runCatchingExceptions([&]() {
      loadStructAndGroups(compiler.getLoader(), loader, 0x823456789abcdef1llu);
    });
  }
}